

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::ArgVisitor<fmt::internal::PrintfArgFormatter<wchar_t>,_void>::visit
          (ArgVisitor<fmt::internal::PrintfArgFormatter<wchar_t>,_void> *this,Arg *arg)

{
  switch(arg->type) {
  case INT:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>::
    visit_any_int<int>((ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t> *)this
                       ,(arg->super_Value).field_0.int_value);
    return;
  case UINT:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>::
    visit_any_int<unsigned_int>
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.uint_value);
    return;
  case LONG_LONG:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>::
    visit_any_int<long_long>
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.long_long_value);
    return;
  case ULONG_LONG:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>::
    visit_any_int<unsigned_long_long>
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.ulong_long_value);
    return;
  case BOOL:
    internal::PrintfArgFormatter<wchar_t>::visit_bool
              ((PrintfArgFormatter<wchar_t> *)this,(arg->super_Value).field_0.int_value != 0);
    return;
  case CHAR:
    internal::PrintfArgFormatter<wchar_t>::visit_char
              ((PrintfArgFormatter<wchar_t> *)this,(arg->super_Value).field_0.int_value);
    return;
  case DOUBLE:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>::
    visit_any_double<double>
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.double_value);
    return;
  case LAST_NUMERIC_TYPE:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>::
    visit_any_double<long_double>
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.long_double_value);
    return;
  case CSTRING:
    internal::PrintfArgFormatter<wchar_t>::visit_cstring
              ((PrintfArgFormatter<wchar_t> *)this,(arg->super_Value).field_0.string.value);
    return;
  case STRING:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>::visit_string
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.string);
    return;
  case WSTRING:
    internal::ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>::visit_wstring
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.wstring);
    return;
  case POINTER:
    internal::PrintfArgFormatter<wchar_t>::visit_pointer
              ((PrintfArgFormatter<wchar_t> *)this,(arg->super_Value).field_0.pointer);
    return;
  case CUSTOM:
    internal::PrintfArgFormatter<wchar_t>::visit_custom
              ((PrintfArgFormatter<wchar_t> *)this,(arg->super_Value).field_0.custom);
    return;
  default:
    return;
  }
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    case Arg::NONE:
    case Arg::NAMED_ARG:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
    return Result();
  }